

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

LoopContinueLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_loopcontinue(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x271) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x271;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    LoopContinueLayerParams::LoopContinueLayerParams(this_00.loopcontinue_);
    (this->layer_).loopcontinue_ = (LoopContinueLayerParams *)this_00;
  }
  return (LoopContinueLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::LoopContinueLayerParams* NeuralNetworkLayer::mutable_loopcontinue() {
  if (!has_loopcontinue()) {
    clear_layer();
    set_has_loopcontinue();
    layer_.loopcontinue_ = new ::CoreML::Specification::LoopContinueLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.loopContinue)
  return layer_.loopcontinue_;
}